

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
MoveAssignmentOverwritesExisting<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>_>
::TestBody(MoveAssignmentOverwritesExisting<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>_>
           *this)

{
  long lVar1;
  char *message;
  Generator<phmap::priv::hash_internal::Enum,_void> gen;
  AssertionResult gtest_ar;
  TypeParam n;
  TypeParam t;
  TypeParam m;
  Generator<phmap::priv::hash_internal::Enum,_void> local_dc1;
  allocator_type local_dc0;
  key_equal local_db8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_db0;
  AssertHelper local_da8;
  Enum local_d9c;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  local_d98;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  local_918;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  local_498;
  
  local_918.sets_._M_elems[0].set_.ctrl_._0_4_ =
       hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(&local_dc1);
  local_918.sets_._M_elems[0].set_.ctrl_._4_4_ =
       hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(&local_dc1);
  local_918.sets_._M_elems[0].set_.slots_._0_4_ =
       hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(&local_dc1);
  local_d98.sets_._M_elems[0].set_.ctrl_ =
       (ctrl_t *)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_;
  local_db8.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)
       (WithId<phmap::priv::StatefulTestingEqual>)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_dc0.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.id_ =
       (size_t)(hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
                next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       (size_t)(hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
                next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
  ::parallel_hash_set<phmap::priv::hash_internal::Enum_const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
              *)&local_498,(Enum *)&local_918,
             (Enum *)((long)&local_918.sets_._M_elems[0].set_.slots_ + 4),0,(hasher *)&local_d98,
             &local_db8,&local_dc0);
  local_d98.sets_._M_elems[0].set_.ctrl_ =
       (ctrl_t *)
       local_498.sets_._M_elems[0].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
       .super__Tuple_impl<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>.
       super__Head_base<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_false>.
       _M_head_impl.id_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::parallel_hash_set(&local_918,&local_498,(allocator_type *)&local_d98);
  local_d9c = hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()
                        (&local_dc1);
  local_db8.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)
       (WithId<phmap::priv::StatefulTestingEqual>)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_;
  local_dc0.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_da8.data_ = (AssertHelperData *)0x0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.id_ =
       (size_t)(hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
                next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
  ::parallel_hash_set<phmap::priv::hash_internal::Enum_const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
              *)&local_d98,&local_d9c,(Enum *)&local_d98,0,(hasher *)&local_db8,
             (key_equal *)&local_dc0,(allocator_type *)&local_da8);
  lVar1 = 0;
  do {
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
    ::move_assign((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                   *)((long)&local_d98.sets_._M_elems[0].set_.ctrl_ + lVar1),
                  (long)&local_918.sets_._M_elems[0].set_.ctrl_ + lVar1);
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x480);
  testing::internal::
  CmpHelperEQ<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,4ul,phmap::NullMutex>,phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,4ul,phmap::NullMutex>>
            ((internal *)&local_db8,"m","n",
             (parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
              *)&local_498,
             (parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
              *)&local_d98);
  if (local_db8.super_WithId<phmap::priv::StatefulTestingEqual>.id_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_dc0);
    if (local_db0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_db0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_da8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x1ca,message);
    testing::internal::AssertHelper::operator=(&local_da8,(Message *)&local_dc0);
    testing::internal::AssertHelper::~AssertHelper(&local_da8);
    if ((long *)local_dc0.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_dc0.id_ + 8))();
    }
  }
  if (local_db0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_db0,local_db0);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::~parallel_hash_set(&local_d98);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::~parallel_hash_set(&local_918);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::~parallel_hash_set(&local_498);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, MoveAssignmentOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  TypeParam m({gen(), gen(), gen()});
  TypeParam t(m);
  TypeParam n({gen()});
  n = std::move(t);
  EXPECT_EQ(m, n);
}